

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::visitBreak(CodeFolding *this,Break *curr)

{
  Block *pBVar1;
  Expression **ppEVar2;
  mapped_type *this_00;
  Tail local_38;
  
  if (curr->condition == (Expression *)0x0) {
    ppEVar2 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                          .controlFlowStack);
    pBVar1 = (Block *)*ppEVar2;
    if ((pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId)
    {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      if ((Break *)*ppEVar2 == curr) {
        this_00 = std::
                  map<wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
                  ::operator[](&this->breakTails,&curr->name);
        local_38.pointer = (Expression **)0x0;
        local_38.expr = (Expression *)curr;
        local_38.block = pBVar1;
        std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
        emplace_back<wasm::CodeFolding::Tail>(this_00,&local_38);
        return;
      }
    }
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->unoptimizables,&curr->name);
  return;
}

Assistant:

void visitBreak(Break* curr) {
    if (curr->condition) {
      unoptimizables.insert(curr->name);
    } else {
      // we can only optimize if we are at the end of the parent block.
      // TODO: Relax this.
      Block* parent = controlFlowStack.back()->dynCast<Block>();
      if (parent && curr == parent->list.back()) {
        breakTails[curr->name].push_back(Tail(curr, parent));
      } else {
        unoptimizables.insert(curr->name);
      }
    }
  }